

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * CTcPrsOpUnary::create_oneof_node(CTcEmbedBuilder *b,CTPNList *lst,char *attrs)

{
  int iVar1;
  CTcSymObj *obj;
  CTcSymbol *pCVar2;
  CTcPrsNode *pCVar3;
  char *siz;
  
  siz = (char *)lst;
  if ((G_prs->field_0xec & 4) == 0) {
    obj = CTcParser::add_gen_obj(G_prs,"OneOfIndexGen");
    if (obj != (CTcSymObj *)0x0) {
      CTcParser::add_gen_obj_prop(G_prs,obj,"numItems",(lst->super_CTPNListBase).cnt_);
      siz = (char *)obj;
      CTcParser::add_gen_obj_prop(G_prs,obj,"listAttrs",attrs);
      goto LAB_001fc956;
    }
    siz = "OneOfIndexGen";
    pCVar2 = CTcPrsSymtab::find(G_prs->global_symtab_,"OneOfIndexGen",0xd);
    if ((pCVar2 == (CTcSymbol *)0x0) ||
       (*(int *)&(pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 !=
        2)) {
      obj = (CTcSymObj *)0x0;
      CTcTokenizer::log_error(0x2d2b);
      goto LAB_001fc956;
    }
  }
  obj = (CTcSymObj *)0x0;
LAB_001fc956:
  pCVar3 = (CTcPrsNode *)CTcPrsAllocObj::operator_new((CTcPrsAllocObj *)0x20,(size_t)siz);
  iVar1 = (**b->_vptr_CTcEmbedBuilder)(b);
  *(int *)&pCVar3[1].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = iVar1;
  pCVar3[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)lst;
  pCVar3[3].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase = (_func_int **)obj;
  (pCVar3->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase = (_func_int **)&PTR_gen_code_00311ec0;
  return pCVar3;
}

Assistant:

CTcPrsNode *CTcPrsOpUnary::create_oneof_node(
    CTcEmbedBuilder *b, CTPNList *lst, const char *attrs)
{
    /*
     *   If we're actually compiling (not just doing a symbol extraction
     *   pass), create our list state object.  This is an anonymous
     *   TadsObject of class OneOfIndexGen, with the following properties:
     *   
     *.    numItems = number of items in the list (integer)
     *.    listAttrs = our 'attrs' list attributes value (string)
     */
    CTcSymObj *obj = 0;
    if (!G_prs->get_syntax_only())
    {
        /* geneate our anonymous OneOfIndexGen instance */
        obj = G_prs->add_gen_obj("OneOfIndexGen");
        if (obj != 0)
        {
            G_prs->add_gen_obj_prop(obj, "numItems", lst->get_count());
            G_prs->add_gen_obj_prop(obj, "listAttrs", attrs);
        }
        else
        {
            /* check to see if OneOfIndexGen is undefined */
            CTcSymbol *cls = G_prs->get_global_symtab()->find(
                "OneOfIndexGen", 13);
            if (cls == 0 || cls->get_type() != TC_SYM_OBJ)
                G_tok->log_error(TCERR_ONEOF_REQ_GENCLS);
        }
    }

    /* return the <<one of>> node */
    return new CTPNStrOneOf(b->is_double(), lst, obj);
}